

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

void __thiscall QDialog::done(QDialog *this,int r)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QDialogPrivate *this_00;
  int in_ESI;
  QPointer<QDialog> *in_RDI;
  long in_FS_OFFSET;
  int dialogCode;
  QDialogPrivate *d;
  QPointer<QDialog> guard;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPointer<QDialog>::QPointer<void>
            (in_RDI,(QDialog *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  this_00 = d_func((QDialog *)0x743ea5);
  QDialogPrivate::close(this_00,in_ESI);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QDialog> *)0x743ec2);
  if (bVar2) {
    iVar3 = (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xb0))();
    if (iVar3 == 1) {
      accepted((QDialog *)0x743ef3);
    }
    else if (iVar3 == 0) {
      rejected((QDialog *)0x743f06);
    }
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QDialog> *)0x743f12);
    if (bVar2) {
      finished((QDialog *)0x743f26,in_stack_ffffffffffffffbc);
    }
  }
  QPointer<QDialog>::~QPointer((QPointer<QDialog> *)0x743f38);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDialog::done(int r)
{
    QPointer<QDialog> guard(this);

    Q_D(QDialog);
    d->close(r);

    if (!guard)
        return;

    int dialogCode = d->dialogCode();
    if (dialogCode == QDialog::Accepted)
        emit accepted();
    else if (dialogCode == QDialog::Rejected)
        emit rejected();

    if (guard)
        emit finished(r);
}